

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BorderAmounts::BorderAmounts(BorderAmounts *this,BorderAmounts *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BorderAmounts_00488180;
  (this->borderamounts_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->borderamounts_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->borderamounts_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->borderamounts_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
            (&(this->borderamounts_).super_RepeatedPtrFieldBase,
             &(from->borderamounts_).super_RepeatedPtrFieldBase);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

BorderAmounts::BorderAmounts(const BorderAmounts& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      borderamounts_(from.borderamounts_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BorderAmounts)
}